

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O1

CordRepBtree * __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::
NewLeaf<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
          (CordRepBtree *this,string_view data,size_t extra)

{
  byte bVar1;
  CordRepBtree *pCVar2;
  CordRepFlat *pCVar3;
  sbyte sVar4;
  CordRepBtree *__n;
  uint8_t uVar5;
  int iVar6;
  CordRepBtree *pCVar7;
  uint8_t *puVar8;
  long lVar9;
  bool bVar10;
  
  pCVar2 = (CordRepBtree *)operator_new(0x40);
  (pCVar2->super_CordRep).refcount = (atomic<int>)0x2;
  (pCVar2->super_CordRep).tag = '\x03';
  (pCVar2->super_CordRep).storage[0] = '\0';
  (pCVar2->super_CordRep).storage[1] = '\0';
  (pCVar2->super_CordRep).storage[2] = '\x06';
  (pCVar2->super_CordRep).length = 0;
  uVar5 = '\x06';
  if (this == (CordRepBtree *)0x0) {
    puVar8 = (uint8_t *)0x0;
  }
  else {
    puVar8 = (uint8_t *)0x0;
    lVar9 = 7;
    do {
      pCVar3 = CordRepFlat::NewImpl<4096ul>((size_t)(data._M_str + (long)&this->super_CordRep));
      bVar1 = (pCVar3->super_CordRep).tag;
      iVar6 = -0xb8000;
      if (bVar1 < 0xbb) {
        iVar6 = -0xe80;
      }
      sVar4 = 0xc;
      if (bVar1 < 0xbb) {
        sVar4 = 6;
      }
      if (bVar1 < 0x43) {
        iVar6 = -0x10;
        sVar4 = 3;
      }
      __n = (CordRepBtree *)(long)(int)(((uint)bVar1 << sVar4) + iVar6 + -0xd);
      if (this < __n) {
        __n = this;
      }
      (pCVar3->super_CordRep).length = (size_t)__n;
      puVar8 = (__n->super_CordRep).storage + (long)(puVar8 + -0xd);
      *(CordRepFlat **)((pCVar2->super_CordRep).storage + lVar9 * 8 + -0xd) = pCVar3;
      pCVar7 = (CordRepBtree *)((long)this - (long)__n);
      memcpy((pCVar3->super_CordRep).storage,(pCVar7->super_CordRep).storage + (data._M_len - 0xd),
             (size_t)__n);
      if (this < pCVar7) {
        pCVar7 = this;
      }
      uVar5 = uVar5 + 0xff;
    } while ((pCVar7 != (CordRepBtree *)0x0) &&
            (bVar10 = lVar9 != 2, this = pCVar7, lVar9 = lVar9 + -1, bVar10));
  }
  (pCVar2->super_CordRep).length = (size_t)puVar8;
  (pCVar2->super_CordRep).storage[1] = uVar5;
  return pCVar2;
}

Assistant:

CordRepBtree* CordRepBtree::NewLeaf<kFront>(absl::string_view data,
                                            size_t extra) {
  CordRepBtree* leaf = CordRepBtree::New(0);
  size_t length = 0;
  size_t begin = leaf->capacity();
  leaf->set_end(leaf->capacity());
  while (!data.empty() && begin != 0) {
    auto* flat = CordRepFlat::New(data.length() + extra);
    flat->length = (std::min)(data.length(), flat->Capacity());
    length += flat->length;
    leaf->edges_[--begin] = flat;
    data = Consume<kFront>(flat->Data(), data, flat->length);
  }
  leaf->length = length;
  leaf->set_begin(begin);
  return leaf;
}